

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O1

void __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::monotoneDecomposition(SimpleToMonotone *this)

{
  Edge *pEVar1;
  uint uVar2;
  int edgeIndex;
  int iVar3;
  int iVar4;
  ulong uVar5;
  QPodPoint *pQVar6;
  bool bVar7;
  ulong uVar8;
  Node *pNVar9;
  Node *parent;
  Edge *pEVar10;
  ulong uVar11;
  Node *node;
  char *pcVar12;
  uint *puVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long in_FS_OFFSET;
  char local_78 [24];
  char *local_60;
  QDataBuffer<std::pair<int,_int>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_edges).siz != 0) {
    local_58.buffer = (pair<int,_int> *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.capacity = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.siz = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QDataBuffer<std::pair<int,_int>_>::QDataBuffer(&local_58,(this->m_upperVertex).siz);
    uVar5 = (this->m_edges).siz;
    uVar11 = 0;
    if (1 < (long)uVar5) {
      pEVar10 = (this->m_edges).buffer;
      pQVar6 = (this->m_parent->m_vertices).buffer;
      puVar13 = &pEVar10[1].from;
      uVar15 = 1;
      do {
        uVar2 = pEVar10[(int)uVar11].from;
        bVar7 = pQVar6[*puVar13].y < pQVar6[uVar2].y;
        if (pQVar6[*puVar13].y == pQVar6[uVar2].y) {
          bVar7 = pQVar6[*puVar13].x < pQVar6[uVar2].x;
        }
        uVar8 = uVar15 & 0xffffffff;
        if (!bVar7) {
          uVar8 = uVar11;
        }
        uVar11 = uVar8;
        uVar15 = uVar15 + 1;
        puVar13 = puVar13 + 10;
      } while (uVar5 != uVar15);
      uVar11 = (ulong)(int)uVar11;
    }
    pEVar10 = (this->m_edges).buffer;
    pQVar6 = (this->m_parent->m_vertices).buffer;
    this->m_clockwiseOrder =
         ((long)pQVar6[pEVar10[uVar11].from].y -
         (long)pQVar6[pEVar10[pEVar10[uVar11].previous].from].y) *
         ((long)pQVar6[pEVar10[uVar11].to].x -
         (long)pQVar6[pEVar10[pEVar10[uVar11].previous].from].x) <
         ((long)pQVar6[pEVar10[uVar11].from].x -
         (long)pQVar6[pEVar10[pEVar10[uVar11].previous].from].x) *
         ((long)pQVar6[pEVar10[uVar11].to].y -
         (long)pQVar6[pEVar10[pEVar10[uVar11].previous].from].y);
    if (0 < (this->m_edges).siz) {
      lVar16 = 0;
      do {
        classifyVertex(this,(int)lVar16);
        lVar16 = lVar16 + 1;
      } while (lVar16 < (this->m_edges).siz);
    }
    fillPriorityQueue(this);
    lVar16 = (this->m_upperVertex).siz;
    if (lVar16 != 0) {
      do {
        pEVar10 = (this->m_edges).buffer;
        edgeIndex = (this->m_upperVertex).buffer[lVar16 + -1];
        (this->m_upperVertex).siz = lVar16 + -1;
        lVar16 = (long)edgeIndex;
        if (SplitVertex < pEVar10[lVar16].type) goto LAB_0044b652;
        pEVar1 = pEVar10 + lVar16;
        iVar3 = pEVar1->previous;
        lVar14 = (long)iVar3;
        switch(pEVar10[lVar16].type) {
        case MergeVertex:
          pNVar9 = searchEdgeLeftOfPoint(this,pEVar1->from);
          if (pNVar9 == (Node *)0x0) {
            local_78[0] = '\x02';
            local_78[1] = '\0';
            local_78[2] = '\0';
            local_78[3] = '\0';
            local_78[4] = '\0';
            local_78[5] = '\0';
            local_78[6] = '\0';
            local_78[7] = '\0';
            local_78[8] = '\0';
            local_78[9] = '\0';
            local_78[10] = '\0';
            local_78[0xb] = '\0';
            local_78[0xc] = '\0';
            local_78[0xd] = '\0';
            local_78[0xe] = '\0';
            local_78[0xf] = '\0';
            local_78[0x10] = '\0';
            local_78[0x11] = '\0';
            local_78[0x12] = '\0';
            local_78[0x13] = '\0';
            local_78[0x14] = '\0';
            local_78[0x15] = '\0';
            local_78[0x16] = '\0';
            local_78[0x17] = '\0';
            local_60 = "default";
            QMessageLogger::warning(local_78,"Inconsistent polygon. (#4)");
          }
          else {
            pEVar10 = (this->m_edges).buffer;
            iVar3 = pEVar10[pNVar9->data].helper;
            if (pEVar10[iVar3].type == MergeVertex) {
              QDataBuffer<std::pair<int,_int>_>::reserve(&local_58,(qsizetype)(local_58.siz + 1));
              local_58.buffer[local_58.siz].first = edgeIndex;
              local_58.buffer[local_58.siz].second = iVar3;
              local_58.siz = local_58.siz + 1;
            }
            (this->m_edges).buffer[pNVar9->data].helper = edgeIndex;
          }
          break;
        case RegularVertex:
          if (pEVar1->pointingUp != this->m_clockwiseOrder) {
            pNVar9 = searchEdgeLeftOfPoint(this,pEVar1->from);
            if (pNVar9 != (Node *)0x0) {
              pEVar10 = (this->m_edges).buffer;
              iVar3 = pEVar10[pNVar9->data].helper;
              if (pEVar10[iVar3].type == MergeVertex) {
                QDataBuffer<std::pair<int,_int>_>::reserve(&local_58,(qsizetype)(local_58.siz + 1));
                local_58.buffer[local_58.siz].first = edgeIndex;
                local_58.buffer[local_58.siz].second = iVar3;
                local_58.siz = local_58.siz + 1;
              }
              (this->m_edges).buffer[pNVar9->data].helper = edgeIndex;
              goto LAB_0044b652;
            }
            pcVar12 = "Inconsistent polygon. (#2)";
            goto LAB_0044b7f9;
          }
          if (pEVar1->node == (Node *)0x0) {
            if (pEVar10[lVar14].node == (Node *)0x0) {
              pcVar12 = "Inconsistent polygon. (#1)";
              goto LAB_0044b7f9;
            }
            iVar3 = pEVar10[lVar14].helper;
            if (pEVar10[iVar3].type == MergeVertex) {
              QDataBuffer<std::pair<int,_int>_>::reserve(&local_58,(qsizetype)(local_58.siz + 1));
              local_58.buffer[local_58.siz].first = edgeIndex;
              local_58.buffer[local_58.siz].second = iVar3;
              local_58.siz = local_58.siz + 1;
            }
            pEVar10 = (this->m_edges).buffer;
            pEVar10[lVar16].node = pEVar10[lVar14].node;
            pEVar10[lVar14].node = (Node *)0x0;
            (pEVar10[lVar16].node)->data = edgeIndex;
            pEVar10[lVar16].helper = edgeIndex;
          }
          else {
            iVar4 = pEVar1->helper;
            if (pEVar10[iVar4].type == MergeVertex) {
              QDataBuffer<std::pair<int,_int>_>::reserve(&local_58,(qsizetype)(local_58.siz + 1));
              local_58.buffer[local_58.siz].first = edgeIndex;
              local_58.buffer[local_58.siz].second = iVar4;
              local_58.siz = local_58.siz + 1;
            }
            pEVar10 = (this->m_edges).buffer;
            pEVar10[lVar14].node = pEVar10[lVar16].node;
            pEVar10[lVar16].node = (Node *)0x0;
            (pEVar10[lVar14].node)->data = iVar3;
            pEVar10[lVar14].helper = edgeIndex;
          }
          goto LAB_0044b652;
        case StartVertex:
          goto switchD_0044b291_caseD_3;
        case SplitVertex:
          pNVar9 = searchEdgeLeftOfPoint(this,pEVar1->from);
          if (pNVar9 == (Node *)0x0) {
            local_78[0] = '\x02';
            local_78[1] = '\0';
            local_78[2] = '\0';
            local_78[3] = '\0';
            local_78[4] = '\0';
            local_78[5] = '\0';
            local_78[6] = '\0';
            local_78[7] = '\0';
            local_78[8] = '\0';
            local_78[9] = '\0';
            local_78[10] = '\0';
            local_78[0xb] = '\0';
            local_78[0xc] = '\0';
            local_78[0xd] = '\0';
            local_78[0xe] = '\0';
            local_78[0xf] = '\0';
            local_78[0x10] = '\0';
            local_78[0x11] = '\0';
            local_78[0x12] = '\0';
            local_78[0x13] = '\0';
            local_78[0x14] = '\0';
            local_78[0x15] = '\0';
            local_78[0x16] = '\0';
            local_78[0x17] = '\0';
            local_60 = "default";
            QMessageLogger::warning(local_78,"Inconsistent polygon. (#3)");
          }
          else {
            iVar4 = (this->m_edges).buffer[pNVar9->data].helper;
            QDataBuffer<std::pair<int,_int>_>::reserve(&local_58,(qsizetype)(local_58.siz + 1));
            local_58.buffer[local_58.siz].first = edgeIndex;
            local_58.buffer[local_58.siz].second = iVar4;
            local_58.siz = local_58.siz + 1;
            (this->m_edges).buffer[pNVar9->data].helper = edgeIndex;
          }
          goto switchD_0044b291_caseD_3;
        }
        if (this->m_clockwiseOrder == true) {
          pEVar10 = (this->m_edges).buffer;
          iVar3 = pEVar10[lVar16].helper;
          if (pEVar10[iVar3].type == MergeVertex) {
            QDataBuffer<std::pair<int,_int>_>::reserve(&local_58,(qsizetype)(local_58.siz + 1));
            local_58.buffer[local_58.siz].first = edgeIndex;
            local_58.buffer[local_58.siz].second = iVar3;
            local_58.siz = local_58.siz + 1;
          }
          pEVar10 = (this->m_edges).buffer;
          pNVar9 = pEVar10[lVar16].node;
          lVar14 = lVar16;
          if (pNVar9 != (Node *)0x0) goto LAB_0044b546;
          pcVar12 = "Inconsistent polygon. (#5)";
LAB_0044b7f9:
          local_60 = "default";
          local_78[0x14] = '\0';
          local_78[0x15] = '\0';
          local_78[0x16] = '\0';
          local_78[0x17] = '\0';
          local_78[0xc] = '\0';
          local_78[0xd] = '\0';
          local_78[0xe] = '\0';
          local_78[0xf] = '\0';
          local_78[0x10] = '\0';
          local_78[0x11] = '\0';
          local_78[0x12] = '\0';
          local_78[0x13] = '\0';
          local_78[4] = '\0';
          local_78[5] = '\0';
          local_78[6] = '\0';
          local_78[7] = '\0';
          local_78[8] = '\0';
          local_78[9] = '\0';
          local_78[10] = '\0';
          local_78[0xb] = '\0';
          local_78[0] = '\x02';
          local_78[1] = '\0';
          local_78[2] = '\0';
          local_78[3] = '\0';
          QMessageLogger::warning(local_78,pcVar12);
        }
        else {
          pEVar10 = (this->m_edges).buffer;
          iVar3 = pEVar10[lVar14].helper;
          if (pEVar10[iVar3].type == MergeVertex) {
            QDataBuffer<std::pair<int,_int>_>::reserve(&local_58,(qsizetype)(local_58.siz + 1));
            local_58.buffer[local_58.siz].first = edgeIndex;
            local_58.buffer[local_58.siz].second = iVar3;
            local_58.siz = local_58.siz + 1;
          }
          pEVar10 = (this->m_edges).buffer;
          pNVar9 = pEVar10[lVar14].node;
          if (pNVar9 == (Node *)0x0) {
            pcVar12 = "Inconsistent polygon. (#6)";
            goto LAB_0044b7f9;
          }
LAB_0044b546:
          pEVar10 = pEVar10 + lVar14;
          QRBTree<int>::detach(&this->m_edgeList,pNVar9);
          pEVar10->node->right = (this->m_edgeList).freeList;
          (this->m_edgeList).freeList = pEVar10->node;
          pEVar10->node = (Node *)0x0;
        }
LAB_0044b652:
        lVar16 = (this->m_upperVertex).siz;
      } while (lVar16 != 0);
    }
    if (0 < local_58.siz) {
      lVar16 = 0;
      do {
        createDiagonal(this,local_58.buffer[lVar16].first,local_58.buffer[lVar16].second);
        lVar16 = lVar16 + 1;
      } while (lVar16 < local_58.siz);
    }
    if (local_58.buffer != (pair<int,_int> *)0x0) {
      QtPrivate::sizedFree(local_58.buffer,local_58.capacity << 3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
switchD_0044b291_caseD_3:
  if (this->m_clockwiseOrder == true) {
    parent = searchEdgeLeftOfEdge(this,iVar3);
    pNVar9 = (this->m_edgeList).freeList;
    if (pNVar9 == (Node *)0x0) {
      pNVar9 = (Node *)operator_new(0x28);
    }
    else {
      (this->m_edgeList).freeList = pNVar9->right;
    }
    pNVar9->parent = (Node *)0x0;
    pNVar9->left = (Node *)0x0;
    pNVar9->right = (Node *)0x0;
    pNVar9->red = true;
    pNVar9->data = iVar3;
    pEVar10 = (this->m_edges).buffer;
    pEVar10[lVar14].node = pNVar9;
    pEVar10[lVar14].helper = edgeIndex;
  }
  else {
    parent = searchEdgeLeftOfEdge(this,edgeIndex);
    pNVar9 = (this->m_edgeList).freeList;
    if (pNVar9 == (Node *)0x0) {
      pNVar9 = (Node *)operator_new(0x28);
    }
    else {
      (this->m_edgeList).freeList = pNVar9->right;
    }
    pNVar9->parent = (Node *)0x0;
    pNVar9->left = (Node *)0x0;
    pNVar9->right = (Node *)0x0;
    pNVar9->red = true;
    pNVar9->data = edgeIndex;
    pEVar10 = (this->m_edges).buffer;
    pEVar10[lVar16].node = pNVar9;
    pEVar10[lVar16].helper = edgeIndex;
  }
  QRBTree<int>::attachAfter(&this->m_edgeList,parent,pNVar9);
  goto LAB_0044b652;
}

Assistant:

void QTriangulator<T>::SimpleToMonotone::monotoneDecomposition()
{
    if (m_edges.isEmpty())
        return;

    Q_ASSERT(!m_edgeList.root);
    QDataBuffer<std::pair<int, int> > diagonals(m_upperVertex.size());

    int i = 0;
    for (int index = 1; index < m_edges.size(); ++index) {
        if (m_parent->m_vertices.at(m_edges.at(index).from) < m_parent->m_vertices.at(m_edges.at(i).from))
            i = index;
    }
    Q_ASSERT(i < m_edges.size());
    int j = m_edges.at(i).previous;
    Q_ASSERT(j < m_edges.size());
    m_clockwiseOrder = qPointIsLeftOfLine(m_parent->m_vertices.at((quint32)m_edges.at(i).from),
        m_parent->m_vertices.at((quint32)m_edges.at(j).from), m_parent->m_vertices.at((quint32)m_edges.at(i).to));

    classifyVertices();
    fillPriorityQueue();

    // debug: set helpers explicitly (shouldn't be necessary)
    //for (int i = 0; i < m_edges.size(); ++i)
    //    m_edges.at(i).helper = m_edges.at(i).upper();

    while (!m_upperVertex.isEmpty()) {
        i = m_upperVertex.last();
        Q_ASSERT(i < m_edges.size());
        m_upperVertex.pop_back();
        j = m_edges.at(i).previous;
        Q_ASSERT(j < m_edges.size());

        QRBTree<int>::Node *leftEdgeNode = nullptr;

        switch (m_edges.at(i).type) {
        case RegularVertex:
            // If polygon interior is to the right of the vertex...
            if (m_edges.at(i).pointingUp == m_clockwiseOrder) {
                if (m_edges.at(i).node) {
                    Q_ASSERT(!m_edges.at(j).node);
                    if (m_edges.at(m_edges.at(i).helper).type == MergeVertex)
                        diagonals.add(std::pair<int, int>(i, m_edges.at(i).helper));
                    m_edges.at(j).node = m_edges.at(i).node;
                    m_edges.at(i).node = nullptr;
                    m_edges.at(j).node->data = j;
                    m_edges.at(j).helper = i;
                } else if (m_edges.at(j).node) {
                    Q_ASSERT(!m_edges.at(i).node);
                    if (m_edges.at(m_edges.at(j).helper).type == MergeVertex)
                        diagonals.add(std::pair<int, int>(i, m_edges.at(j).helper));
                    m_edges.at(i).node = m_edges.at(j).node;
                    m_edges.at(j).node = nullptr;
                    m_edges.at(i).node->data = i;
                    m_edges.at(i).helper = i;
                } else {
                    qWarning("Inconsistent polygon. (#1)");
                }
            } else {
                leftEdgeNode = searchEdgeLeftOfPoint(m_edges.at(i).from);
                if (leftEdgeNode) {
                    if (m_edges.at(m_edges.at(leftEdgeNode->data).helper).type == MergeVertex)
                        diagonals.add(std::pair<int, int>(i, m_edges.at(leftEdgeNode->data).helper));
                    m_edges.at(leftEdgeNode->data).helper = i;
                } else {
                    qWarning("Inconsistent polygon. (#2)");
                }
            }
            break;
        case SplitVertex:
            leftEdgeNode = searchEdgeLeftOfPoint(m_edges.at(i).from);
            if (leftEdgeNode) {
                diagonals.add(std::pair<int, int>(i, m_edges.at(leftEdgeNode->data).helper));
                m_edges.at(leftEdgeNode->data).helper = i;
            } else {
                qWarning("Inconsistent polygon. (#3)");
            }
            Q_FALLTHROUGH();
        case StartVertex:
            if (m_clockwiseOrder) {
                leftEdgeNode = searchEdgeLeftOfEdge(j);
                QRBTree<int>::Node *node = m_edgeList.newNode();
                node->data = j;
                m_edges.at(j).node = node;
                m_edges.at(j).helper = i;
                m_edgeList.attachAfter(leftEdgeNode, node);
                Q_ASSERT(m_edgeList.validate());
            } else  {
                leftEdgeNode = searchEdgeLeftOfEdge(i);
                QRBTree<int>::Node *node = m_edgeList.newNode();
                node->data = i;
                m_edges.at(i).node = node;
                m_edges.at(i).helper = i;
                m_edgeList.attachAfter(leftEdgeNode, node);
                Q_ASSERT(m_edgeList.validate());
            }
            break;
        case MergeVertex:
            leftEdgeNode = searchEdgeLeftOfPoint(m_edges.at(i).from);
            if (leftEdgeNode) {
                if (m_edges.at(m_edges.at(leftEdgeNode->data).helper).type == MergeVertex)
                    diagonals.add(std::pair<int, int>(i, m_edges.at(leftEdgeNode->data).helper));
                m_edges.at(leftEdgeNode->data).helper = i;
            } else {
                qWarning("Inconsistent polygon. (#4)");
            }
            Q_FALLTHROUGH();
        case EndVertex:
            if (m_clockwiseOrder) {
                if (m_edges.at(m_edges.at(i).helper).type == MergeVertex)
                    diagonals.add(std::pair<int, int>(i, m_edges.at(i).helper));
                if (m_edges.at(i).node) {
                    m_edgeList.deleteNode(m_edges.at(i).node);
                    Q_ASSERT(m_edgeList.validate());
                } else {
                    qWarning("Inconsistent polygon. (#5)");
                }
            } else {
                if (m_edges.at(m_edges.at(j).helper).type == MergeVertex)
                    diagonals.add(std::pair<int, int>(i, m_edges.at(j).helper));
                if (m_edges.at(j).node) {
                    m_edgeList.deleteNode(m_edges.at(j).node);
                    Q_ASSERT(m_edgeList.validate());
                } else {
                    qWarning("Inconsistent polygon. (#6)");
                }
            }
            break;
        }
    }

    for (int i = 0; i < diagonals.size(); ++i)
        createDiagonal(diagonals.at(i).first, diagonals.at(i).second);
}